

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_load.c
# Opt level: O3

int lua_loadx(lua_State *L,lua_Reader reader,void *data,char *chunkname,char *mode)

{
  int iVar1;
  ulong uVar2;
  LexState ls;
  LexState local_c0;
  
  local_c0.chunkarg = "?";
  if (chunkname != (char *)0x0) {
    local_c0.chunkarg = chunkname;
  }
  local_c0.sb.L.ptr32 = (uint32_t)L;
  local_c0.sb.p.ptr32 = 0;
  local_c0.sb.e.ptr32 = 0;
  local_c0.sb.b.ptr32 = 0;
  local_c0.rfunc = reader;
  local_c0.rdata = data;
  local_c0.mode = mode;
  iVar1 = lj_vm_cpcall(L,0,&local_c0,cpparser);
  lj_lex_cleanup(L,&local_c0);
  uVar2 = (ulong)(L->glref).ptr32;
  if (*(uint *)(uVar2 + 0x54) <= *(uint *)(uVar2 + 0x50)) {
    lj_gc_step(L);
  }
  return iVar1;
}

Assistant:

LUA_API int lua_loadx(lua_State *L, lua_Reader reader, void *data,
		      const char *chunkname, const char *mode)
{
  LexState ls;
  int status;
  ls.rfunc = reader;
  ls.rdata = data;
  ls.chunkarg = chunkname ? chunkname : "?";
  ls.mode = mode;
  lj_buf_init(L, &ls.sb);
  status = lj_vm_cpcall(L, NULL, &ls, cpparser);
  lj_lex_cleanup(L, &ls);
  lj_gc_check(L);
  return status;
}